

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::typedef_<wasm::WATParser::ParseTypeDefsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  Name name_00;
  bool bVar1;
  size_t sVar2;
  Name *pNVar3;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Ok local_149 [32];
  allocator<char> local_129;
  string local_128;
  Err local_108;
  uint local_e4;
  Err local_e0;
  Err *local_c0;
  Err *err;
  undefined1 local_a8 [8];
  Result<wasm::Ok> _val;
  Result<wasm::Ok> sub;
  optional<wasm::Name> id;
  Name name;
  Index local_20;
  size_t pos;
  ParseTypeDefsCtx *ctx_local;
  
  sVar2 = Lexer::getPos(&ctx->in);
  expected = sv("type",4);
  bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar1) {
    wasm::Name::Name((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                              super__Optional_payload_base<wasm::Name>._M_engaged);
    Lexer::takeID((optional<wasm::Name> *)
                  ((long)&sub.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&ctx->in);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional *)
                       ((long)&sub.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    if (bVar1) {
      pNVar3 = std::optional<wasm::Name>::operator*
                         ((optional<wasm::Name> *)
                          ((long)&sub.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      wasm::Name::operator=
                ((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                          super__Optional_payload_base<wasm::Name>._M_engaged,pNVar3);
    }
    __return_storage_ptr___00 =
         (__index_type *)
         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    subtype<wasm::WATParser::ParseTypeDefsCtx>((Result<wasm::Ok> *)__return_storage_ptr___00,ctx);
    Result<wasm::Ok>::Result
              ((Result<wasm::Ok> *)local_a8,(Result<wasm::Ok> *)__return_storage_ptr___00);
    local_c0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_a8);
    bVar1 = local_c0 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_e0,local_c0);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_e0);
      wasm::Err::~Err(&local_e0);
    }
    local_e4 = (uint)bVar1;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_a8);
    if (local_e4 == 0) {
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (bVar1) {
        local_149[1] = (Ok)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._M_engaged;
        local_149[2] = (Ok)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._17_1_;
        local_149[3] = (Ok)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._18_1_;
        local_149[4] = (Ok)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._19_1_;
        local_149[5] = (Ok)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._20_1_;
        local_149[6] = (Ok)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._21_1_;
        local_149[7] = (Ok)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._22_1_;
        local_149[8] = (Ok)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._23_1_;
        local_20 = (Index)sVar2;
        name_00.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
        name_00.super_IString.str._M_len =
             id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._16_8_;
        ParseTypeDefsCtx::finishTypeDef(ctx,name_00,local_20);
        MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,local_149);
        local_e4 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"expected end of type definition",&local_129);
        Lexer::err(&local_108,&ctx->in,&local_128);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_108);
        wasm::Err::~Err(&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator(&local_129);
        local_e4 = 1;
      }
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  else {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> typedef_(Ctx& ctx) {
  auto pos = ctx.in.getPos();

  if (!ctx.in.takeSExprStart("type"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto sub = subtype(ctx);
  CHECK_ERR(sub);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of type definition");
  }

  ctx.finishTypeDef(name, pos);
  return Ok{};
}